

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O1

bool anon_unknown.dwarf_22493e::checkPixels<float>
               (Array2D<float> *ph,int lx,int rx,int ly,int ry,int width)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  bool local_8b;
  
  local_8b = ry < ly;
  if (ly <= ry) {
    lVar3 = (long)lx;
    lVar11 = (long)ly * 4;
    iVar10 = lx + ly * width + 1;
    lVar9 = (long)ly;
    do {
      if (lx <= rx) {
        fVar1 = ph->_data[ph->_sizeY * lVar9 + lVar3];
        iVar12 = ((int)lVar9 * width + lx) % 0x801;
        lVar7 = lVar3;
        bVar2 = rx < lx;
        if ((fVar1 == (float)iVar12) && (!NAN(fVar1) && !NAN((float)iVar12))) {
          pfVar4 = (float *)((long)ph->_data + ph->_sizeY * lVar11 + lVar3 * 4 + 4);
          lVar7 = 0;
          iVar8 = iVar10;
          do {
            if (lx - rx == (int)lVar7) goto LAB_00188c5a;
            fVar1 = *pfVar4;
            iVar12 = iVar8 % 0x801;
            lVar7 = lVar7 + -1;
            pfVar4 = pfVar4 + 1;
            iVar8 = iVar8 + 1;
          } while ((fVar1 == (float)iVar12) && (!NAN(fVar1) && !NAN((float)iVar12)));
          bVar2 = (long)rx <= (lVar3 + -1) - lVar7;
          lVar7 = lVar3 - lVar7;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::ostream::_M_insert<double>((double)ph->_data[ph->_sizeY * lVar9 + lVar7]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
        plVar6 = (long *)std::ostream::operator<<(poVar5,iVar12);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::ostream::flush();
        if (!bVar2) {
          return local_8b;
        }
      }
LAB_00188c5a:
      lVar7 = lVar9 + 1;
      local_8b = ry <= lVar9;
      lVar11 = lVar11 + 4;
      iVar10 = iVar10 + width;
      lVar9 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return local_8b;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}